

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

CharReader * __thiscall Json::CharReaderBuilder::newCharReader(CharReaderBuilder *this)

{
  UInt UVar1;
  Value *pVVar2;
  OurCharReader *this_00;
  Value *this_01;
  undefined1 local_30 [8];
  OurFeatures features;
  bool collectComments;
  CharReaderBuilder *this_local;
  
  this_01 = &this->settings_;
  pVVar2 = Value::operator[](this_01,"collectComments");
  features.stackLimit_._7_1_ = Value::asBool(pVVar2);
  OurFeatures::all();
  pVVar2 = Value::operator[](this_01,"allowComments");
  local_30[0] = Value::asBool(pVVar2);
  pVVar2 = Value::operator[](this_01,"allowTrailingCommas");
  local_30[1] = Value::asBool(pVVar2);
  pVVar2 = Value::operator[](this_01,"strictRoot");
  local_30[2] = Value::asBool(pVVar2);
  pVVar2 = Value::operator[](this_01,"allowDroppedNullPlaceholders");
  local_30[3] = Value::asBool(pVVar2);
  pVVar2 = Value::operator[](this_01,"allowNumericKeys");
  local_30[4] = Value::asBool(pVVar2);
  pVVar2 = Value::operator[](this_01,"allowSingleQuotes");
  local_30[5] = Value::asBool(pVVar2);
  pVVar2 = Value::operator[](this_01,"stackLimit");
  UVar1 = Value::asUInt(pVVar2);
  features._8_8_ = ZEXT48(UVar1);
  pVVar2 = Value::operator[](this_01,"failIfExtra");
  local_30[6] = Value::asBool(pVVar2);
  pVVar2 = Value::operator[](this_01,"rejectDupKeys");
  local_30[7] = Value::asBool(pVVar2);
  pVVar2 = Value::operator[](this_01,"allowSpecialFloats");
  features.allowComments_ = Value::asBool(pVVar2);
  pVVar2 = Value::operator[](this_01,"skipBom");
  features.allowTrailingCommas_ = Value::asBool(pVVar2);
  this_00 = (OurCharReader *)operator_new(0x140);
  OurCharReader::OurCharReader
            (this_00,(bool)(features.stackLimit_._7_1_ & 1),(OurFeatures *)local_30);
  return &this_00->super_CharReader;
}

Assistant:

CharReader* CharReaderBuilder::newCharReader() const {
  bool collectComments = settings_["collectComments"].asBool();
  OurFeatures features = OurFeatures::all();
  features.allowComments_ = settings_["allowComments"].asBool();
  features.allowTrailingCommas_ = settings_["allowTrailingCommas"].asBool();
  features.strictRoot_ = settings_["strictRoot"].asBool();
  features.allowDroppedNullPlaceholders_ =
      settings_["allowDroppedNullPlaceholders"].asBool();
  features.allowNumericKeys_ = settings_["allowNumericKeys"].asBool();
  features.allowSingleQuotes_ = settings_["allowSingleQuotes"].asBool();

  // Stack limit is always a size_t, so we get this as an unsigned int
  // regardless of it we have 64-bit integer support enabled.
  features.stackLimit_ = static_cast<size_t>(settings_["stackLimit"].asUInt());
  features.failIfExtra_ = settings_["failIfExtra"].asBool();
  features.rejectDupKeys_ = settings_["rejectDupKeys"].asBool();
  features.allowSpecialFloats_ = settings_["allowSpecialFloats"].asBool();
  features.skipBom_ = settings_["skipBom"].asBool();
  return new OurCharReader(collectComments, features);
}